

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O1

void nn_cws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  ulong extraout_RAX;
  
  if (type == -3 && src == -2) goto LAB_00138926;
  while ((*(int *)&self[1].fn != 10 || (nn_cws_shutdown_cold_2(), (extraout_RAX & 1) == 0))) {
    if (*(int *)&self[1].fn == 0xb) {
      nn_cws_shutdown_cold_4();
      return;
    }
    nn_cws_shutdown_cold_3();
LAB_00138926:
    nn_cws_shutdown_cold_1();
  }
  return;
}

Assistant:

static void nn_cws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sws_isidle (&cws->sws)) {
            nn_ep_stat_increment (cws->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sws_stop (&cws->sws);
        }
        cws->state = NN_CWS_STATE_STOPPING_SWS_FINAL;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING_SWS_FINAL)) {
        if (!nn_sws_isidle (&cws->sws))
            return;
        nn_backoff_stop (&cws->retry);
        nn_usock_stop (&cws->usock);
        nn_dns_stop (&cws->dns);
        cws->state = NN_CWS_STATE_STOPPING;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cws->retry) ||
              !nn_usock_isidle (&cws->usock) ||
              !nn_dns_isidle (&cws->dns))
            return;
        cws->state = NN_CWS_STATE_IDLE;
        nn_fsm_stopped_noevent (&cws->fsm);
        nn_ep_stopped (cws->ep);
        return;
    }

    nn_fsm_bad_state (cws->state, src, type);
}